

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O3

void __thiscall QSqlTableModelPrivate::initRecordAndPrimaryIndex(QSqlTableModelPrivate *this)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> QVar5;
  Data *pDVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  Data *pDVar9;
  bool *pbVar10;
  QSqlRecord QVar11;
  int size;
  long in_FS_OFFSET;
  QSqlIndex local_88;
  QSqlRecord local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QSqlDatabase::record((QSqlDatabase *)&local_38,(QString *)&this->db);
  QVar11.d.d.ptr = local_38.d.d.ptr;
  local_38.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
  local_88.super_QSqlRecord.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (this->super_QSqlQueryModelPrivate).rec.d.d.ptr;
  (this->super_QSqlQueryModelPrivate).rec.d.d.ptr = (QSqlRecordPrivate *)QVar11.d.d.ptr;
  QSqlRecord::~QSqlRecord(&local_88.super_QSqlRecord);
  QSqlRecord::~QSqlRecord(&local_38);
  QSqlDatabase::primaryIndex(&local_88,&this->db,&this->tableName);
  QVar5.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)
                (this->primaryIndex).super_QSqlRecord.d.d.ptr;
  pDVar6 = (this->primaryIndex).cursor.d.d;
  (this->primaryIndex).super_QSqlRecord.d.d.ptr =
       (QSqlRecordPrivate *)local_88.super_QSqlRecord.d.d.ptr;
  (this->primaryIndex).cursor.d.d = local_88.cursor.d.d;
  pcVar1 = (this->primaryIndex).cursor.d.ptr;
  (this->primaryIndex).cursor.d.ptr = local_88.cursor.d.ptr;
  qVar2 = (this->primaryIndex).cursor.d.size;
  (this->primaryIndex).cursor.d.size = local_88.cursor.d.size;
  pDVar7 = (this->primaryIndex).nm.d.d;
  pcVar8 = (this->primaryIndex).nm.d.ptr;
  (this->primaryIndex).nm.d.d = local_88.nm.d.d;
  (this->primaryIndex).nm.d.ptr = local_88.nm.d.ptr;
  qVar3 = (this->primaryIndex).nm.d.size;
  (this->primaryIndex).nm.d.size = local_88.nm.d.size;
  pDVar9 = (this->primaryIndex).sorts.d.d;
  pbVar10 = (this->primaryIndex).sorts.d.ptr;
  (this->primaryIndex).sorts.d.d = local_88.sorts.d.d;
  (this->primaryIndex).sorts.d.ptr = local_88.sorts.d.ptr;
  qVar4 = (this->primaryIndex).sorts.d.size;
  (this->primaryIndex).sorts.d.size = local_88.sorts.d.size;
  local_88.super_QSqlRecord.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)QVar5.d.ptr;
  local_88.cursor.d.d = pDVar6;
  local_88.cursor.d.ptr = pcVar1;
  local_88.cursor.d.size = qVar2;
  local_88.nm.d.d = pDVar7;
  local_88.nm.d.ptr = pcVar8;
  local_88.nm.d.size = qVar3;
  local_88.sorts.d.d = pDVar9;
  local_88.sorts.d.ptr = pbVar10;
  local_88.sorts.d.size = qVar4;
  QSqlIndex::~QSqlIndex(&local_88);
  size = QSqlRecord::count(&(this->super_QSqlQueryModelPrivate).rec);
  QSqlQueryModelPrivate::initColOffsets(&this->super_QSqlQueryModelPrivate,size);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlTableModelPrivate::initRecordAndPrimaryIndex()
{
    rec = db.record(tableName);
    primaryIndex = db.primaryIndex(tableName);
    initColOffsets(rec.count());
}